

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O1

void ym2413_update_emu(void *chip,UINT32 samples,DEV_SMPL **out)

{
  ulong uVar1;
  int32_t buffers [2];
  DEV_SMPL local_30;
  DEV_SMPL local_2c;
  
  if (samples != 0) {
    uVar1 = 0;
    do {
      EOPLL_calcStereo((EOPLL *)chip,&local_30);
      (*out)[uVar1] = local_30;
      out[1][uVar1] = local_2c;
      uVar1 = uVar1 + 1;
    } while (samples != uVar1);
  }
  return;
}

Assistant:

static void ym2413_update_emu(void *chip, UINT32 samples, DEV_SMPL **out)
{
	EOPLL *opll = (EOPLL *)chip;
	int32_t buffers[2];
	uint32_t i;
	
	for (i=0; i < samples; i++)
	{
		EOPLL_calcStereo(opll, buffers);
		out[0][i] = buffers[0];
		out[1][i] = buffers[1];
	}
	
	return;
}